

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Compaction * __thiscall leveldb::VersionSet::PickCompaction(VersionSet *this)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  pointer *pppFVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Version *pVVar5;
  Options *pOVar6;
  size_type sVar7;
  size_type sVar8;
  int iVar9;
  Compaction *c;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar10;
  FileMetaData **__args;
  ulong uVar11;
  iterator iVar12;
  vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *this_00;
  int iVar13;
  long lVar14;
  FileMetaData *f;
  InternalKey smallest;
  InternalKey largest;
  FileMetaData *local_78;
  InternalKey local_70;
  InternalKey local_50;
  
  pVVar5 = this->current_;
  if (1.0 <= pVVar5->compaction_score_) {
    iVar13 = pVVar5->compaction_level_;
    lVar14 = (long)iVar13;
    if (lVar14 < 0) {
      __assert_fail("level >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x4e9,"Compaction *leveldb::VersionSet::PickCompaction()");
    }
    if (5 < iVar13) {
      __assert_fail("level + 1 < config::kNumLevels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x4ea,"Compaction *leveldb::VersionSet::PickCompaction()");
    }
    c = (Compaction *)operator_new(0x158);
    pOVar6 = this->options_;
    c->level_ = iVar13;
    c->max_output_file_size_ = pOVar6->max_file_size;
    c->input_version_ = (Version *)0x0;
    (c->edit_).comparator_._M_dataplus._M_p = (pointer)&(c->edit_).comparator_.field_2;
    (c->edit_).comparator_._M_string_length = 0;
    (c->edit_).comparator_.field_2._M_local_buf[0] = '\0';
    (c->edit_).compact_pointers_.
    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (c->edit_).compact_pointers_.
    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (c->edit_).compact_pointers_.
    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var2 = &(c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header;
    (c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    (c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
    (c->edit_).new_files_.
    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (c->edit_).new_files_.
    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (c->edit_).new_files_.
    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    VersionEdit::Clear(&c->edit_);
    this_00 = (vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)c->inputs_;
    c->level_ptrs_[5] = 0;
    c->level_ptrs_[6] = 0;
    c->level_ptrs_[3] = 0;
    c->level_ptrs_[4] = 0;
    c->level_ptrs_[1] = 0;
    c->level_ptrs_[2] = 0;
    c->overlapped_bytes_ = 0;
    c->level_ptrs_[0] = 0;
    c->inputs_[0].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    c->inputs_[0].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    c->inputs_[0].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    c->inputs_[1].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    c->inputs_[1].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    c->inputs_[1].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (c->grandparents_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (c->grandparents_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (c->grandparents_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    c->grandparent_index_ = 0;
    c->seen_key_ = false;
    pVVar5 = this->current_;
    if (pVVar5->files_[lVar14].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        pVVar5->files_[lVar14].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pvVar10 = pVVar5->files_ + lVar14;
      uVar11 = 0;
      do {
        local_78 = (pvVar10->
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar11];
        sVar7 = this->compact_pointer_[lVar14]._M_string_length;
        if (sVar7 == 0) {
LAB_001171d2:
          iVar12._M_current =
               c->inputs_[0].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              c->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
            _M_realloc_insert<leveldb::FileMetaData*const&>(this_00,iVar12,&local_78);
          }
          else {
            *iVar12._M_current = local_78;
            pppFVar3 = &c->inputs_[0].
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppFVar3 = *pppFVar3 + 1;
          }
          break;
        }
        sVar8 = (local_78->largest).rep_._M_string_length;
        if (sVar8 == 0) {
          __assert_fail("!rep_.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/dbformat.h"
                        ,0x96,"Slice leveldb::InternalKey::Encode() const");
        }
        local_70.rep_._M_dataplus._M_p = (local_78->largest).rep_._M_dataplus._M_p;
        local_50.rep_._M_dataplus._M_p = this->compact_pointer_[lVar14]._M_dataplus._M_p;
        local_70.rep_._M_string_length = sVar8;
        local_50.rep_._M_string_length = sVar7;
        iVar9 = InternalKeyComparator::Compare(&this->icmp_,(Slice *)&local_70,(Slice *)&local_50);
        if (0 < iVar9) goto LAB_001171d2;
        uVar11 = uVar11 + 1;
        pvVar10 = this->current_->files_ + lVar14;
      } while (uVar11 < (ulong)((long)this->current_->files_[lVar14].
                                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar10->
                                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    iVar12._M_current =
         c->inputs_[0].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (c->inputs_[0].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start != iVar12._M_current) goto LAB_00117254;
    __args = this->current_->files_[lVar14].
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (iVar12._M_current !=
        c->inputs_[0].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0011723a;
  }
  else {
    if (pVVar5->file_to_compact_ == (FileMetaData *)0x0) {
      return (Compaction *)0x0;
    }
    iVar13 = pVVar5->file_to_compact_level_;
    c = (Compaction *)operator_new(0x158);
    pOVar6 = this->options_;
    c->level_ = iVar13;
    c->max_output_file_size_ = pOVar6->max_file_size;
    c->input_version_ = (Version *)0x0;
    (c->edit_).comparator_._M_dataplus._M_p = (pointer)&(c->edit_).comparator_.field_2;
    (c->edit_).comparator_._M_string_length = 0;
    (c->edit_).comparator_.field_2._M_local_buf[0] = '\0';
    (c->edit_).compact_pointers_.
    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (c->edit_).compact_pointers_.
    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (c->edit_).compact_pointers_.
    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var2 = &(c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header;
    (c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    (c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
    (c->edit_).new_files_.
    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (c->edit_).new_files_.
    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (c->edit_).deleted_files_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (c->edit_).new_files_.
    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    VersionEdit::Clear(&c->edit_);
    c->level_ptrs_[5] = 0;
    c->level_ptrs_[6] = 0;
    c->level_ptrs_[3] = 0;
    c->level_ptrs_[4] = 0;
    c->level_ptrs_[1] = 0;
    c->level_ptrs_[2] = 0;
    c->overlapped_bytes_ = 0;
    c->level_ptrs_[0] = 0;
    c->inputs_[0].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    c->inputs_[0].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    c->inputs_[0].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    c->inputs_[1].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    c->inputs_[1].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    c->inputs_[1].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (c->grandparents_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (c->grandparents_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (c->grandparents_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    c->grandparent_index_ = 0;
    c->seen_key_ = false;
    __args = &this->current_->file_to_compact_;
    iVar12._M_current =
         c->inputs_[0].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar12._M_current !=
        c->inputs_[0].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0011723a:
      *iVar12._M_current = *__args;
      pppFVar3 = &c->inputs_[0].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar3 = *pppFVar3 + 1;
      goto LAB_00117254;
    }
    this_00 = (vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)c->inputs_;
  }
  std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
  _M_realloc_insert<leveldb::FileMetaData*const&>(this_00,iVar12,__args);
LAB_00117254:
  pVVar5 = this->current_;
  c->input_version_ = pVVar5;
  piVar1 = &pVVar5->refs_;
  *piVar1 = *piVar1 + 1;
  if (iVar13 == 0) {
    local_70.rep_._M_dataplus._M_p = (pointer)&local_70.rep_.field_2;
    local_70.rep_._M_string_length = 0;
    local_70.rep_.field_2._M_local_buf[0] = '\0';
    paVar4 = &local_50.rep_.field_2;
    local_50.rep_._M_string_length = 0;
    local_50.rep_.field_2._M_local_buf[0] = '\0';
    local_50.rep_._M_dataplus._M_p = (pointer)paVar4;
    GetRange(this,c->inputs_,&local_70,&local_50);
    Version::GetOverlappingInputs(this->current_,0,&local_70,&local_50,c->inputs_);
    if (c->inputs_[0].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        c->inputs_[0].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!c->inputs_[0].empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x50d,"Compaction *leveldb::VersionSet::PickCompaction()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.rep_._M_dataplus._M_p != paVar4) {
      operator_delete(local_50.rep_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.rep_._M_dataplus._M_p != &local_70.rep_.field_2) {
      operator_delete(local_70.rep_._M_dataplus._M_p);
    }
  }
  SetupOtherInputs(this,c);
  return c;
}

Assistant:

Compaction* VersionSet::PickCompaction() {
  Compaction* c;
  int level;

  // We prefer compactions triggered by too much data in a level over
  // the compactions triggered by seeks.
  const bool size_compaction = (current_->compaction_score_ >= 1);
  const bool seek_compaction = (current_->file_to_compact_ != nullptr);
  if (size_compaction) {
    level = current_->compaction_level_;
    assert(level >= 0);
    assert(level + 1 < config::kNumLevels);
    c = new Compaction(options_, level);

    // Pick the first file that comes after compact_pointer_[level]
    for (size_t i = 0; i < current_->files_[level].size(); i++) {
      FileMetaData* f = current_->files_[level][i];
      if (compact_pointer_[level].empty() ||
          icmp_.Compare(f->largest.Encode(), compact_pointer_[level]) > 0) {
        c->inputs_[0].push_back(f);
        break;
      }
    }
    if (c->inputs_[0].empty()) {
      // Wrap-around to the beginning of the key space
      c->inputs_[0].push_back(current_->files_[level][0]);
    }
  } else if (seek_compaction) {
    level = current_->file_to_compact_level_;
    c = new Compaction(options_, level);
    c->inputs_[0].push_back(current_->file_to_compact_);
  } else {
    return nullptr;
  }

  c->input_version_ = current_;
  c->input_version_->Ref();

  // Files in level 0 may overlap each other, so pick up all overlapping ones
  if (level == 0) {
    InternalKey smallest, largest;
    GetRange(c->inputs_[0], &smallest, &largest);
    // Note that the next call will discard the file we placed in
    // c->inputs_[0] earlier and replace it with an overlapping set
    // which will include the picked file.
    current_->GetOverlappingInputs(0, &smallest, &largest, &c->inputs_[0]);
    assert(!c->inputs_[0].empty());
  }

  SetupOtherInputs(c);

  return c;
}